

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O3

void u_versionFromString_63(uint8_t *versionArray,char *versionString)

{
  char *in_RAX;
  ulong uVar1;
  ulong uVar2;
  char *__nptr;
  char *end;
  char *local_28;
  
  if (versionArray == (uint8_t *)0x0) {
    return;
  }
  if (versionString != (char *)0x0) {
    local_28 = in_RAX;
    uVar1 = strtoul(versionString,&local_28,10);
    *versionArray = (uint8_t)uVar1;
    if (local_28 != versionString) {
      uVar1 = 1;
      do {
        uVar2 = uVar1;
        if (uVar2 == 4) {
          return;
        }
        if (*local_28 != '.') break;
        __nptr = local_28 + 1;
        uVar1 = strtoul(__nptr,&local_28,10);
        versionArray[uVar2] = (uint8_t)uVar1;
        uVar1 = uVar2 + 1;
      } while (local_28 != __nptr);
      if (2 < uVar2 - 1) {
        return;
      }
      goto LAB_002a6061;
    }
  }
  uVar2 = 0;
LAB_002a6061:
  memset(versionArray + (uVar2 & 0xffff),0,(ulong)(4U - (int)uVar2 & 0xffff));
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionFromString(UVersionInfo versionArray, const char *versionString) {
    char *end;
    uint16_t part=0;

    if(versionArray==NULL) {
        return;
    }

    if(versionString!=NULL) {
        for(;;) {
            versionArray[part]=(uint8_t)uprv_strtoul(versionString, &end, 10);
            if(end==versionString || ++part==U_MAX_VERSION_LENGTH || *end!=U_VERSION_DELIMITER) {
                break;
            }
            versionString=end+1;
        }
    }

    while(part<U_MAX_VERSION_LENGTH) {
        versionArray[part++]=0;
    }
}